

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.c
# Opt level: O3

int labldef(int lval,int flag)

{
  t_symbol *ptVar1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  uint uVar5;
  
  ptVar1 = lablptr;
  iVar2 = page;
  if (lablptr == (t_symbol *)0x0) {
    return 0;
  }
  uVar5 = page << 0xd | lval & 0x1fffU;
  if (flag == 0) {
    uVar5 = lval;
  }
  if (pass != 0) {
    if (lablptr->value != uVar5) {
LAB_00112b95:
      pcVar4 = "Internal error[1]!";
LAB_00112b9c:
      fatal_error(pcVar4);
      return -1;
    }
    if (flag == 0) {
      return 0;
    }
    if ((bank < bank_limit) && (lablptr->bank != bank + bank_base)) goto LAB_00112b95;
    goto LAB_00112bd7;
  }
  switch(lablptr->type) {
  case 1:
    lablptr->type = 4;
    ptVar1->value = uVar5;
    goto LAB_00112bcf;
  case 2:
    pcVar4 = "Can not define this label, declared as undefined in an IF expression!";
    break;
  default:
    if (lablptr->reserved != 0) {
      pcVar4 = "Reserved symbol!";
      goto LAB_00112b9c;
    }
    if (lablptr->value != uVar5) {
      ptVar1->type = 3;
      ptVar1->value = 0;
      pcVar4 = "Label multiply defined!";
      break;
    }
LAB_00112bcf:
    if (flag == 0) {
      return 0;
    }
LAB_00112bd7:
    if (section == 2) {
      ptVar1->proc = proc_ptr;
    }
    else {
      iVar3 = bank;
      if ((uint)section < 2) goto LAB_00112c10;
    }
    iVar3 = bank + bank_base;
LAB_00112c10:
    ptVar1->bank = iVar3;
    ptVar1->page = iVar2;
    if ((ptVar1->name[1] != '@') && (ptVar1->name[1] != '.')) {
      glablptr = ptVar1;
      lastlabl = ptVar1;
      return 0;
    }
    lastlabl = (t_symbol *)0x0;
    return 0;
  case 5:
    pcVar4 = "Symbol already used by a macro!";
    break;
  case 6:
    pcVar4 = "Symbol already used by a function!";
  }
  error(pcVar4);
  return -1;
}

Assistant:

int
labldef(int lval, int flag)
{
	char c;

	/* check for NULL ptr */
	if (lablptr == NULL)
		return (0);

	/* adjust symbol address */
	if (flag)
		lval = (lval & 0x1FFF) | (page << 13);

	/* first pass */
	if (pass == FIRST_PASS) {
		switch (lablptr->type) {
		/* undefined */
		case UNDEF:
			lablptr->type = DEFABS;
			lablptr->value = lval;
			break;

		/* already defined - error */
		case IFUNDEF:
			error("Can not define this label, declared as undefined in an IF expression!");
			return (-1);

		case MACRO:
			error("Symbol already used by a macro!");
			return (-1);

		case FUNC:
			error("Symbol already used by a function!");
			return (-1);

		default:
			/* reserved label */
			if (lablptr->reserved) {
				fatal_error("Reserved symbol!");
				return (-1);
			}

			/* compare the values */
			if (lablptr->value == lval)
				break;

			/* normal label */
			lablptr->type = MDEF;
			lablptr->value = 0;
			error("Label multiply defined!");
			return (-1);
		}
	}

	/* second pass */
	else {
		if ((lablptr->value != lval) ||
		   ((flag) && (bank < bank_limit) && (lablptr->bank  != bank_base + bank)))
		{
			fatal_error("Internal error[1]!");
			return (-1);
		}
	}

	/* update symbol data */
	if (flag) {
		if (section == S_CODE)
			lablptr->proc = proc_ptr;

		if ((section == S_BSS) || (section == S_ZP))
		{
			lablptr->bank = bank;
		} else {
			lablptr->bank = bank_base + bank;
		}
		lablptr->page = page;

		/* check if it's a local or global symbol */
		c = lablptr->name[1];
		if (c == '.' || c == '@')
			/* local */
			lastlabl = NULL;
		else {
			/* global */
			glablptr = lablptr;
			lastlabl = lablptr;
		}
	}

	/* ok */
	return (0);
}